

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O1

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
exclusiveOrExpression(Tokenizer *tokenizer)

{
  __uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> __p;
  Token *pTVar1;
  tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_> this;
  Tokenizer *in_RSI;
  _List_node_base *p_Var2;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp2;
  undefined1 local_60 [16];
  __uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> local_50;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> local_48;
  __uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> local_40;
  _List_node_base *local_38;
  
  andExpression((Tokenizer *)local_60);
  if ((ExpressionInternal *)local_60._0_8_ == (ExpressionInternal *)0x0) {
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
  }
  else {
    do {
      pTVar1 = Tokenizer::peekToken(in_RSI,0);
      if (pTVar1->type != Caret) {
        (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
        super__List_node_base._M_next = (_List_node_base *)local_60._0_8_;
        local_60._0_8_ = (ExpressionInternal *)0x0;
        break;
      }
      Tokenizer::eatTokens(in_RSI,1);
      andExpression((Tokenizer *)(local_60 + 8));
      if ((_List_node_base *)local_60._8_8_ == (_List_node_base *)0x0) {
        (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
        super__List_node_base._M_next = (_List_node_base *)0x0;
        p_Var2 = (_List_node_base *)local_60._8_8_;
      }
      else {
        local_38 = (_List_node_base *)local_60._8_8_;
        this.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
        super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
             operator_new(0x50);
        local_40._M_t.
        super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
        super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
             (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
             (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)local_60._0_8_;
        local_60._0_8_ =
             (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0;
        local_48._M_t.
        super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>._M_t.
        super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
        super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
             (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>
              )(__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>
                )local_60._8_8_;
        local_60._8_8_ = (_List_node_base *)0x0;
        ExpressionInternal::
        ExpressionInternal<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                  ((ExpressionInternal *)
                   this.
                   super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
                   .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl,Xor,
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   &local_40,&local_48);
        local_50._M_t.
        super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
        super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
             (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
             (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
             this.
             super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
             super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                  (&local_48);
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                  ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   &local_40);
        __p._M_t.
        super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
        super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
             local_50._M_t.
             super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
             super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
        local_50._M_t.
        super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
        super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
             (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
             (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0;
        std::__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::reset
                  ((__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   local_60,(pointer)__p._M_t.
                                     super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
                                     .super__Head_base<0UL,_ExpressionInternal_*,_false>.
                                     _M_head_impl);
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                  ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   &local_50);
        p_Var2 = local_38;
      }
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 (local_60 + 8));
    } while (p_Var2 != (_List_node_base *)0x0);
  }
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_60);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> exclusiveOrExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = andExpression(tokenizer);
	if (exp == nullptr)
		return nullptr;

	while (tokenizer.peekToken().type == TokenType::Caret)
	{
		tokenizer.eatToken();

		std::unique_ptr<ExpressionInternal> exp2 = andExpression(tokenizer);
		if (exp2 == nullptr)
			return nullptr;

		exp = std::make_unique<ExpressionInternal>(OperatorType::Xor, std::move(exp), std::move(exp2));
	}

	return exp;
}